

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronized_timer.cpp
# Opt level: O2

void __thiscall
jessilib::synchonrized_callback::synchonrized_callback
          (synchonrized_callback *this,synchonrized_callback *in_callback)

{
  std::function<void_(jessilib::timer_&)>::function(&this->m_callback,&in_callback->m_callback);
  (this->m_calls).super___atomic_base<unsigned_int>._M_i = 0;
  cancel_token::cancel_token(&this->m_cancel_token);
  return;
}

Assistant:

synchonrized_callback(synchonrized_callback&& in_callback)
		: m_callback{ std::move(in_callback.m_callback) } {
		// Empty ctor body
	}